

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O1

int * Gia_ManFraigSelectReprs(Gia_Man_t *p,Gia_Man_t *pClp,int fVerbose,int *pFlopTypes)

{
  undefined1 *puVar1;
  uint uVar2;
  void *pvVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int *__s;
  undefined4 *__s_00;
  Gia_Obj_t *pGVar7;
  Vec_Int_t *pVVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  uint *puVar14;
  uint uVar15;
  uint uVar16;
  size_t sVar17;
  int iVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  Gia_Obj_t *pGVar22;
  int *piVar23;
  uint local_58;
  
  sVar17 = (long)p->nObjs << 2;
  pvVar3 = p->pManTime;
  __s = (int *)malloc(sVar17);
  memset(__s,0xff,sVar17);
  iVar12 = pClp->nObjs;
  sVar17 = (long)iVar12 * 4;
  __s_00 = (undefined4 *)malloc(sVar17);
  memset(__s_00,0xff,sVar17);
  if (pvVar3 == (void *)0x0) {
    __assert_fail("pManTime != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0x1d0,"int *Gia_ManFraigSelectReprs(Gia_Man_t *, Gia_Man_t *, int, int *)");
  }
  uVar21 = 0;
  uVar13 = 0;
  if (1 < iVar12) {
    pGVar7 = pClp->pObjs;
    uVar13 = 0;
    uVar10 = 1;
    uVar21 = 0;
    do {
      pGVar7 = pGVar7 + 1;
      if ((-1 < (int)*(uint *)pGVar7 || (~*(uint *)pGVar7 & 0x1fffffff) == 0) &&
         (uVar19 = (ulong)(uint)pClp->pReprs[uVar10] & 0xfffffff,
         uVar10 != uVar19 && uVar19 != 0xfffffff)) {
        if ((int)uVar19 == 0) {
          uVar21 = (ulong)((int)uVar21 + 1);
        }
        else {
          uVar13 = (ulong)((int)uVar13 + 1);
        }
      }
      uVar10 = uVar10 + 1;
    } while ((long)iVar12 != uVar10);
  }
  if (fVerbose != 0) {
    printf("Computed %d const objects and %d other objects.\n",uVar21,uVar13);
  }
  Gia_ManCleanMark0(p);
  iVar12 = p->vCos->nSize;
  iVar18 = p->nRegs;
  iVar4 = Gia_ManRegBoxNum(p);
  uVar15 = iVar12 - (iVar4 + iVar18);
  pVVar8 = p->vCos;
  iVar12 = pVVar8->nSize;
  if ((int)uVar15 < iVar12 - p->nRegs) {
    uVar13 = (ulong)uVar15;
    do {
      if (((int)uVar15 < 0) || (iVar12 <= (int)uVar13)) goto LAB_0022f08b;
      iVar12 = pVVar8->pArray[uVar13];
      if (((long)iVar12 < 0) || (p->nObjs <= iVar12)) goto LAB_0022f06c;
      pGVar7 = p->pObjs + iVar12;
      uVar21 = (ulong)((uint)*(undefined8 *)pGVar7 & 0x1fffffff);
      if (((uint)*(ulong *)(pGVar7 + -uVar21) & 0x9fffffff) != 0x9fffffff) {
        __assert_fail("Gia_ObjIsCi(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                      ,0x1e6,"int *Gia_ManFraigSelectReprs(Gia_Man_t *, Gia_Man_t *, int, int *)");
      }
      *(ulong *)(pGVar7 + -uVar21) = *(ulong *)(pGVar7 + -uVar21) | 0x40000000;
      uVar13 = uVar13 + 1;
      pVVar8 = p->vCos;
      iVar12 = pVVar8->nSize;
    } while ((int)uVar13 < iVar12 - p->nRegs);
  }
  pVVar8 = Gia_ManComputeCarryOuts(p);
  uVar15 = pVVar8->nSize;
  if (0 < (long)(int)uVar15) {
    piVar23 = pVVar8->pArray;
    lVar11 = 0;
    do {
      iVar12 = piVar23[lVar11];
      if (((long)iVar12 < 0) || (p->nObjs <= iVar12)) goto LAB_0022f06c;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      puVar1 = &p->pObjs[iVar12].field_0x3;
      *puVar1 = *puVar1 | 0x40;
      lVar11 = lVar11 + 1;
    } while ((int)uVar15 != lVar11);
  }
  if (fVerbose != 0) {
    uVar5 = Gia_ManRegBoxNum(p);
    uVar6 = Gia_ManNonRegBoxNum(p);
    printf("Fixed %d flop inputs and %d box/box connections (out of %d non-flop boxes).\n",
           (ulong)uVar5,(ulong)uVar15,(ulong)uVar6);
  }
  if (pVVar8->pArray != (int *)0x0) {
    free(pVVar8->pArray);
    pVVar8->pArray = (int *)0x0;
  }
  if (pVVar8 != (Vec_Int_t *)0x0) {
    free(pVVar8);
  }
  pFlopTypes[2] = 0;
  pFlopTypes[0] = 0;
  pFlopTypes[1] = 0;
  uVar13 = (ulong)(uint)pClp->nRegs;
  if (0 < pClp->nRegs) {
    pVVar8 = pClp->vCis;
    lVar11 = 0;
    do {
      iVar12 = pVVar8->nSize;
      uVar15 = iVar12 - (int)uVar13;
      uVar13 = (ulong)uVar15 + lVar11;
      iVar18 = (int)uVar13;
      if ((iVar18 < 0) || (iVar12 <= iVar18)) {
LAB_0022f08b:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar12 = pVVar8->pArray[uVar13 & 0xffffffff];
      if (((long)iVar12 < 0) || (pClp->nObjs <= iVar12)) goto LAB_0022f06c;
      pGVar7 = pClp->pObjs;
      if (pGVar7 == (Gia_Obj_t *)0x0) break;
      uVar13 = (ulong)(uint)pClp->pReprs[lVar11] & 0xfffffff;
      if (uVar13 == 0xfffffff) {
        pGVar22 = (Gia_Obj_t *)0x0;
      }
      else {
        if (pClp->nObjs <= (int)uVar13) goto LAB_0022f06c;
        pGVar22 = pGVar7 + uVar13;
      }
      if (((pGVar22 != (Gia_Obj_t *)0x0) && (pGVar22 != pGVar7 + iVar12)) &&
         ((piVar23 = pFlopTypes, pGVar22 == pGVar7 ||
          ((((uint)*(undefined8 *)pGVar22 & 0x9fffffff) == 0x9fffffff &&
           (piVar23 = pFlopTypes + 1,
           (int)uVar15 <= (int)((uint)((ulong)*(undefined8 *)pGVar22 >> 0x20) & 0x1fffffff))))))) {
        *piVar23 = *piVar23 + 1;
      }
      lVar11 = lVar11 + 1;
      uVar13 = (ulong)pClp->nRegs;
    } while (lVar11 < (long)uVar13);
  }
  *__s_00 = 0;
  Gia_ManSetPhase(pClp);
  uVar5 = p->nObjs;
  local_58 = 0;
  uVar15 = 0;
  if (1 < (int)uVar5) {
    pGVar7 = p->pObjs;
    puVar14 = &pGVar7[1].Value;
    uVar15 = 0;
    uVar13 = 1;
    local_58 = 0;
    do {
      uVar6 = (uint)*(ulong *)(puVar14 + -2);
      uVar21 = *(ulong *)(puVar14 + -2) & 0x1fffffff;
      if (((uVar6 & 0xdfffffff) != 0xdfffffff) && (-1 < (int)uVar6 || uVar21 == 0x1fffffff)) {
        if (((uVar6 & 0x9fffffff) != 0x9fffffff) && ((int)uVar6 < 0 || (int)uVar21 == 0x1fffffff)) {
          __assert_fail("Gia_ObjIsCi(pObj) || Gia_ObjIsAnd(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                        ,0x209,"int *Gia_ManFraigSelectReprs(Gia_Man_t *, Gia_Man_t *, int, int *)")
          ;
        }
        uVar6 = *puVar14;
        if (uVar6 != 0xffffffff) {
          if ((int)uVar6 < 0) {
LAB_0022f0c9:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          uVar21 = (ulong)(uVar6 >> 1);
          uVar9 = (uint)pClp->pReprs[uVar21] & 0xfffffff;
          uVar10 = (ulong)uVar9;
          if (uVar9 == 0xfffffff) {
            uVar10 = uVar21;
          }
          uVar9 = __s_00[uVar10];
          uVar19 = (ulong)uVar9;
          if (uVar19 == 0xffffffff) {
            __s_00[uVar10] = (int)uVar13;
          }
          else {
            if (uVar5 <= uVar9) goto LAB_0022f06c;
            uVar2 = pGVar7[uVar19].Value;
            if ((int)uVar2 < 0) goto LAB_0022f0c9;
            uVar16 = uVar2 >> 1;
            uVar20 = (uint)pClp->pReprs[uVar16] & 0xfffffff;
            if (uVar20 == 0xfffffff) {
              uVar20 = uVar16;
            }
            if ((uint)uVar10 != uVar20) {
              __assert_fail("Gia_ObjReprSelf(pClp, Abc_Lit2Var(iLitClp)) == Gia_ObjReprSelf(pClp, Abc_Lit2Var(iLitClp2))"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                            ,0x213,
                            "int *Gia_ManFraigSelectReprs(Gia_Man_t *, Gia_Man_t *, int, int *)");
            }
            if ((pClp->nObjs <= (int)(uVar6 >> 1)) || (pClp->nObjs <= (int)uVar16))
            goto LAB_0022f06c;
            __s[uVar13] = ((uint)((ulong)*(undefined8 *)(pClp->pObjs + uVar16) >> 0x3f) ^
                          (uint)((ulong)*(undefined8 *)(pClp->pObjs + uVar21) >> 0x3f) ^
                          (uVar6 ^ uVar2) & 1) + uVar9 * 2;
            if (uVar13 <= uVar19) {
              __assert_fail("Abc_Lit2Var(pReprs[i]) < i",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                            ,0x218,
                            "int *Gia_ManFraigSelectReprs(Gia_Man_t *, Gia_Man_t *, int, int *)");
            }
            if (uVar19 == 0) {
              local_58 = local_58 + 1;
            }
            else {
              uVar15 = uVar15 + 1;
            }
          }
        }
      }
      uVar13 = uVar13 + 1;
      puVar14 = puVar14 + 3;
    } while (uVar5 != uVar13);
  }
  free(__s_00);
  pVVar8 = p->vCis;
  if (0 < pVVar8->nSize) {
    lVar11 = 0;
    do {
      iVar12 = pVVar8->pArray[lVar11];
      if (((long)iVar12 < 0) || (p->nObjs <= iVar12)) {
LAB_0022f06c:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      puVar1 = &p->pObjs[iVar12].field_0x3;
      *puVar1 = *puVar1 & 0xbf;
      lVar11 = lVar11 + 1;
      pVVar8 = p->vCis;
    } while (lVar11 < pVVar8->nSize);
  }
  if (fVerbose != 0) {
    printf("Found %d const objects and %d other objects.\n",(ulong)local_58,(ulong)uVar15);
  }
  return __s;
}

Assistant:

int * Gia_ManFraigSelectReprs( Gia_Man_t * p, Gia_Man_t * pClp, int fVerbose, int pFlopTypes[3] )
{
    Gia_Obj_t * pObj;
    Vec_Int_t * vCarryOuts;
    Tim_Man_t * pManTime = (Tim_Man_t *)p->pManTime;
    int * pReprs   = ABC_FALLOC( int, Gia_ManObjNum(p) );
    int * pClp2Gia = ABC_FALLOC( int, Gia_ManObjNum(pClp) );
    int i, iLitClp, iLitClp2, iReprClp, fCompl;
    int nConsts = 0, nReprs = 0;
    assert( pManTime != NULL );
    // count the number of equivalent objects
    Gia_ManForEachObj1( pClp, pObj, i )
    {
        if ( Gia_ObjIsCo(pObj) )
            continue;
        if ( i == Gia_ObjReprSelf(pClp, i) )
            continue;
        if ( Gia_ObjReprSelf(pClp, i) == 0 )
            nConsts++;
        else
            nReprs++;
    }
    if ( fVerbose )
        printf( "Computed %d const objects and %d other objects.\n", nConsts, nReprs );
    nConsts = nReprs = 0;

    // mark flop input boxes
    Gia_ManCleanMark0( p );
    for ( i = Gia_ManPoNum(p) - Gia_ManRegBoxNum(p); i < Gia_ManPoNum(p); i++ )
    {
        pObj = Gia_ObjFanin0( Gia_ManPo(p, i) );
        assert( Gia_ObjIsCi(pObj) );
        pObj->fMark0 = 1;
    }
    // mark connects between last box inputs and first box outputs
    vCarryOuts = Gia_ManComputeCarryOuts( p );
    Gia_ManForEachObjVec( vCarryOuts, p, pObj, i )
        pObj->fMark0 = 1;
    if ( fVerbose )
        printf( "Fixed %d flop inputs and %d box/box connections (out of %d non-flop boxes).\n", 
            Gia_ManRegBoxNum(p), Vec_IntSize(vCarryOuts), Gia_ManNonRegBoxNum(p) );
    Vec_IntFree( vCarryOuts );

    // collect equivalent node info
    pFlopTypes[0] = pFlopTypes[1] = pFlopTypes[2] = 0;
    Gia_ManForEachRo( pClp, pObj, i )
    {
        Gia_Obj_t * pRepr = Gia_ObjReprObj(pClp, i);
        if ( pRepr && pRepr != pObj )
        {
            if ( pRepr == Gia_ManConst0(pClp) )
                pFlopTypes[0]++;
            else if ( Gia_ObjIsRo(pClp, pRepr) )
                pFlopTypes[1]++;
        }
    }

    // compute representatives
    pClp2Gia[0] = 0;
    Gia_ManSetPhase( pClp );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsCo(pObj) )
            continue;
        if ( Gia_ObjIsCi(pObj) && pObj->fMark0 ) // skip CI pointed by CO
            continue;
        assert( Gia_ObjIsCi(pObj) || Gia_ObjIsAnd(pObj) );
        iLitClp = Gia_ObjValue(pObj);
        if ( iLitClp == -1 )
            continue;
        iReprClp = Gia_ObjReprSelf( pClp, Abc_Lit2Var(iLitClp) );
        if ( pClp2Gia[iReprClp] == -1 )
            pClp2Gia[iReprClp] = i;
        else
        { 
            iLitClp2 = Gia_ObjValue( Gia_ManObj(p, pClp2Gia[iReprClp]) );
            assert( Gia_ObjReprSelf(pClp, Abc_Lit2Var(iLitClp)) == Gia_ObjReprSelf(pClp, Abc_Lit2Var(iLitClp2)) );
            fCompl  = Abc_LitIsCompl(iLitClp) ^ Abc_LitIsCompl(iLitClp2);
            fCompl ^= Gia_ManObj(pClp, Abc_Lit2Var(iLitClp))->fPhase;
            fCompl ^= Gia_ManObj(pClp, Abc_Lit2Var(iLitClp2))->fPhase;
            pReprs[i] = Abc_Var2Lit( pClp2Gia[iReprClp], fCompl );
            assert( Abc_Lit2Var(pReprs[i]) < i );
            if ( pClp2Gia[iReprClp] == 0 )
                nConsts++;
            else
                nReprs++;
        }
    }
    ABC_FREE( pClp2Gia );
    Gia_ManForEachCi( p, pObj, i )
        pObj->fMark0 = 0;
    if ( fVerbose )
        printf( "Found %d const objects and %d other objects.\n", nConsts, nReprs );
    return pReprs;
}